

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O2

void __thiscall
blcl::net::server_interface<MsgType>::server_interface
          (server_interface<MsgType> *this,uint16_t port)

{
  data_union local_4c;
  
  this->_vptr_server_interface = (_func_int **)&PTR__server_interface_001224c8;
  tsqueue<blcl::net::owned_message<MsgType>_>::tsqueue(&this->incoming_messages_);
  std::
  _Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::_Deque_base(&(this->connections_).
                 super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
               );
  asio::io_context::io_context(&this->context_);
  (this->ctx_thread_)._M_id._M_thread = 0;
  local_4c.v6.sin6_scope_id = 0;
  local_4c.base.sa_data[6] = '\0';
  local_4c.base.sa_data[7] = '\0';
  local_4c.base.sa_data[8] = '\0';
  local_4c.base.sa_data[9] = '\0';
  local_4c.base.sa_data[10] = '\0';
  local_4c.base.sa_data[0xb] = '\0';
  local_4c.base.sa_data[0xc] = '\0';
  local_4c.base.sa_data[0xd] = '\0';
  local_4c._16_8_ = 0;
  local_4c.v4.sin_port = port << 8 | port >> 8;
  local_4c.base.sa_family = 2;
  local_4c.v6.sin6_flowinfo = 0;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            (&this->asio_acceptor_,&this->context_,(endpoint_type *)&local_4c.base,true,0);
  this->id_counter_ = 10000;
  return;
}

Assistant:

server_interface(uint16_t port)
            : asio_acceptor_(context_, asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port))
        {

        }